

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midimapper.cpp
# Opt level: O2

bool __thiscall rtosc::MidiMappernRT::hasPending(MidiMappernRT *this,string *addr)

{
  _Elt_pointer ppVar1;
  __type _Var2;
  _Elt_pointer ppVar3;
  _Elt_pointer ppVar4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool> s;
  _Map_pointer local_60;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_58;
  
  ppVar4 = (this->learnQueue).
           super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppVar3 = (this->learnQueue).
           super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
  local_60 = (this->learnQueue).
             super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar1 = (this->learnQueue).
           super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  while (ppVar4 != ppVar1) {
    std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
    ::pair(&local_58,ppVar4);
    _Var2 = std::operator==(&local_58.first,addr);
    std::__cxx11::string::~string((string *)&local_58);
    if (_Var2) break;
    ppVar4 = ppVar4 + 1;
    if (ppVar4 == ppVar3) {
      ppVar4 = local_60[1];
      local_60 = local_60 + 1;
      ppVar3 = ppVar4 + 0xc;
    }
  }
  return ppVar4 != ppVar1;
}

Assistant:

bool MidiMappernRT::hasPending(std::string addr)
{
    for(auto s:learnQueue)
        if(s.first == addr)
            return true;
    return false;
}